

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::system(char *__command)

{
  size_t sVar1;
  char *__command_00;
  byte in_DL;
  int out_val;
  char *ncommand;
  uint l;
  bool is_verbose_local;
  char *module_name_local;
  char *command_local;
  
  module_name_local = __command;
  unused<char_const*>((char **)&l);
  if ((in_DL & 1) == 0) {
    sVar1 = strlen(module_name_local);
    if ((int)sVar1 == 0) {
      command_local._4_4_ = -1;
    }
    else {
      __command_00 = (char *)operator_new__((ulong)((int)sVar1 + 0x18));
      memcpy(__command_00,module_name_local,sVar1 & 0xffffffff);
      strcpy(__command_00 + (sVar1 & 0xffffffff)," >/dev/null 2>&1");
      command_local._4_4_ = ::system(__command_00);
      if (__command_00 != (char *)0x0) {
        operator_delete__(__command_00);
      }
    }
  }
  else {
    command_local._4_4_ = ::system(module_name_local);
  }
  return command_local._4_4_;
}

Assistant:

inline int system(const char *const command, const char *const module_name=0, const bool is_verbose=false) {
      cimg::unused(module_name);
#ifdef cimg_no_system_calls
      return -1;
#else
      if (is_verbose) return std::system(command);
#if cimg_OS==1
      const unsigned int l = (unsigned int)std::strlen(command);
      if (l) {
        char *const ncommand = new char[l + 24];
        std::memcpy(ncommand,command,l);
        std::strcpy(ncommand + l," >/dev/null 2>&1"); // Make command silent
        const int out_val = std::system(ncommand);
        delete[] ncommand;
        return out_val;
      } else return -1;
#elif cimg_OS==2
      PROCESS_INFORMATION pi;
      STARTUPINFO si;
      std::memset(&pi,0,sizeof(PROCESS_INFORMATION));
      std::memset(&si,0,sizeof(STARTUPINFO));
      GetStartupInfo(&si);
      si.cb = sizeof(si);
      si.wShowWindow = SW_HIDE;
      si.dwFlags |= SW_HIDE | STARTF_USESHOWWINDOW;
      const BOOL res = CreateProcess((LPCTSTR)module_name,(LPTSTR)command,0,0,FALSE,0,0,0,&si,&pi);
      if (res) {
        WaitForSingleObject(pi.hProcess,INFINITE);
        CloseHandle(pi.hThread);
        CloseHandle(pi.hProcess);
        return 0;
      } else return std::system(command);
#else
      return std::system(command);
#endif
#endif
    }